

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmGhsMultiTargetGenerator::WriteCustomCommandsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,cmCustomCommandGenerator *ccg)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  ulong uVar5;
  long lVar6;
  reference pbVar7;
  ostream *poVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c_1;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  undefined1 local_241;
  undefined1 local_240 [7];
  bool has_slash;
  byte local_219;
  undefined1 local_218 [7];
  bool had_slash;
  string local_1f8;
  undefined1 local_1d8 [8];
  string suffix;
  undefined1 local_1b0 [7];
  bool useCall;
  string cmd;
  undefined1 local_188 [4];
  uint c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  allocator<char> local_141;
  undefined1 local_140 [8];
  string cdStr;
  string cdCmd;
  undefined1 local_f8 [8];
  string echocmd;
  char *comment;
  string local_c8 [8];
  string check_error;
  string workingDir;
  string currentBinDir;
  undefined1 local_58 [8];
  string dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmdLines;
  cmCustomCommandGenerator *ccg_local;
  ostream *fout_local;
  cmGhsMultiTargetGenerator *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&dir.field_2 + 8));
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  std::__cxx11::string::string((string *)local_58,(string *)psVar4);
  std::__cxx11::string::string((string *)(workingDir.field_2._M_local_buf + 8),(string *)local_58);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_
            ((string *)((long)&check_error.field_2 + 8),ccg);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::__cxx11::string::operator=
              ((string *)local_58,(string *)(check_error.field_2._M_local_buf + 8));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c8,"if [[ $? -ne 0 ]]; then exit 1; fi",(allocator<char> *)((long)&comment + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&comment + 7));
  echocmd.field_2._8_8_ = cmCustomCommandGenerator::GetComment(ccg);
  if (((char *)echocmd.field_2._8_8_ != (char *)0x0) && (*(char *)echocmd.field_2._8_8_ != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_f8,"echo ",(allocator<char> *)(cdCmd.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(cdCmd.field_2._M_local_buf + 0xf));
    std::__cxx11::string::operator+=((string *)local_f8,(char *)echocmd.field_2._8_8_);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&dir.field_2 + 8),(value_type *)local_f8);
    std::__cxx11::string::~string((string *)local_f8);
  }
  std::__cxx11::string::string((string *)(cdStr.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_140,"cd ",&local_141);
  std::allocator<char>::~allocator(&local_141);
  cmOutputConverter::ConvertToOutputFormat
            ((string *)local_188,
             &(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
             (string *)local_58,SHELL);
  std::operator+(&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188);
  std::__cxx11::string::operator=((string *)(cdStr.field_2._M_local_buf + 8),(string *)&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&dir.field_2 + 8),(value_type *)(cdStr.field_2._M_local_buf + 8));
  for (cmd.field_2._12_4_ = 0; uVar1 = cmd.field_2._12_4_,
      uVar3 = cmCustomCommandGenerator::GetNumberOfCommands(ccg), (uint)uVar1 < uVar3;
      cmd.field_2._12_4_ = cmd.field_2._12_4_ + 1) {
    cmCustomCommandGenerator::GetCommand_abi_cxx11_((string *)local_1b0,ccg,cmd.field_2._12_4_);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      suffix.field_2._M_local_buf[0xf] = '\0';
      if ((this->CmdWindowsShell & 1U) != 0) {
        std::__cxx11::string::string((string *)local_1d8);
        uVar5 = std::__cxx11::string::size();
        if (4 < uVar5) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_218,(ulong)local_1b0);
          cmsys::SystemTools::LowerCase(&local_1f8,(string *)local_218);
          std::__cxx11::string::operator=((string *)local_1d8,(string *)&local_1f8);
          std::__cxx11::string::~string((string *)&local_1f8);
          std::__cxx11::string::~string((string *)local_218);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_1d8,".bat");
          if ((bVar2) ||
             (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_1d8,".cmd"), bVar2)) {
            suffix.field_2._M_local_buf[0xf] = '\x01';
          }
        }
        std::__cxx11::string::~string((string *)local_1d8);
      }
      cmsys::SystemTools::ReplaceString((string *)local_1b0,"/./","/");
      lVar6 = std::__cxx11::string::find((char)local_1b0,0x2f);
      local_219 = lVar6 != -1;
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) != 0) {
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)local_240,&this->LocalGenerator->super_cmLocalGenerator,
                   (string *)((long)&workingDir.field_2 + 8),(string *)local_1b0);
        std::__cxx11::string::operator=((string *)local_1b0,(string *)local_240);
        std::__cxx11::string::~string((string *)local_240);
      }
      lVar6 = std::__cxx11::string::find((char)local_1b0,0x2f);
      local_241 = lVar6 != -1;
      if (((local_219 & 1) != 0) && (!(bool)local_241)) {
        std::operator+(&local_268,"./",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0);
        std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_268);
        std::__cxx11::string::~string((string *)&local_268);
      }
      cmOutputConverter::ConvertToOutputFormat
                (&local_288,&(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
                 (string *)local_1b0,SHELL);
      std::__cxx11::string::operator=((string *)local_1b0,(string *)&local_288);
      std::__cxx11::string::~string((string *)&local_288);
      if ((suffix.field_2._M_local_buf[0xf] & 1U) != 0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &__range1,"call ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b0);
        std::__cxx11::string::operator=((string *)local_1b0,(string *)&__range1);
        std::__cxx11::string::~string((string *)&__range1);
      }
      cmCustomCommandGenerator::AppendArguments(ccg,cmd.field_2._12_4_,(string *)local_1b0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&dir.field_2 + 8),(value_type *)local_1b0);
    }
    std::__cxx11::string::~string((string *)local_1b0);
  }
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&dir.field_2 + 8);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(this_00);
  c_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&c_1), bVar2) {
    pbVar7 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    poVar8 = std::operator<<(fout,(string *)pbVar7);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<(fout,local_c8);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)(cdStr.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)(check_error.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(workingDir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&dir.field_2 + 8));
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteCustomCommandsHelper(
  std::ostream& fout, cmCustomCommandGenerator const& ccg)
{
  std::vector<std::string> cmdLines;

  // if the command specified a working directory use it.
  std::string dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  std::string currentBinDir = dir;
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }

  // Line to check for error between commands.
#ifdef _WIN32
  std::string check_error = "if %errorlevel% neq 0 exit /b %errorlevel%";
#else
  std::string check_error = "if [[ $? -ne 0 ]]; then exit 1; fi";
#endif

#ifdef _WIN32
  cmdLines.push_back("@echo off");
#endif
  // Echo the custom command's comment text.
  const char* comment = ccg.GetComment();
  if (comment && *comment) {
    std::string echocmd = "echo ";
    echocmd += comment;
    cmdLines.push_back(std::move(echocmd));
  }

  // Switch to working directory
  std::string cdCmd;
#ifdef _WIN32
  std::string cdStr = "cd /D ";
#else
  std::string cdStr = "cd ";
#endif
  cdCmd = cdStr +
    this->LocalGenerator->ConvertToOutputFormat(dir, cmOutputConverter::SHELL);
  cmdLines.push_back(std::move(cdCmd));

  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->CmdWindowsShell) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd =
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir, cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = "./" + cmd;
      }
      cmd = this->LocalGenerator->ConvertToOutputFormat(
        cmd, cmOutputConverter::SHELL);
      if (useCall) {
        cmd = "call " + cmd;
      }
      ccg.AppendArguments(c, cmd);
      cmdLines.push_back(std::move(cmd));
    }
  }

  // push back the custom commands
  for (auto const& c : cmdLines) {
    fout << c << std::endl;
    fout << check_error << std::endl;
  }
}